

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase184::run(TestCase184 *this)

{
  bool **ppbVar1;
  Disposer *pDVar2;
  SingularDerivedDynamic *pSVar3;
  void *ptrCopy;
  void *ptrCopy_2;
  SingularDerivedDynamic *pSVar4;
  bool destructorCalled_1;
  Own<kj::(anonymous_namespace)::SingularDerivedDynamic> ptr;
  bool destructorCalled;
  Own<kj::(anonymous_namespace)::DynamicType2> basePtr;
  
  _destructorCalled = _destructorCalled & 0xffffff00;
  basePtr.disposer = (Disposer *)CONCAT44(basePtr.disposer._4_4_,0x7b);
  heap<kj::(anonymous_namespace)::SingularDerivedDynamic,int,bool&>
            ((kj *)&ptr,(int *)&basePtr,&destructorCalled);
  pSVar3 = ptr.ptr;
  pDVar2 = ptr.disposer;
  if (ptr.ptr == (SingularDerivedDynamic *)0x0) {
    pSVar4 = (SingularDerivedDynamic *)0x0;
  }
  else {
    pSVar4 = (SingularDerivedDynamic *)
             ((long)&((ptr.ptr)->super_DynamicType1)._vptr_DynamicType1 +
             (long)((ptr.ptr)->super_DynamicType1)._vptr_DynamicType1[-2]);
  }
  ptr.ptr = (SingularDerivedDynamic *)0x0;
  if ((pSVar4 != pSVar3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0xc5,ERROR,"\"failed: expected \" \"voidPtr.get() == implicitCast<void*>(addr)\"",
               (char (*) [60])"failed: expected voidPtr.get() == implicitCast<void*>(addr)");
  }
  if (pSVar4 != (SingularDerivedDynamic *)0x0) {
    (**pDVar2->_vptr_Disposer)(pDVar2,pSVar4);
  }
  Own<kj::(anonymous_namespace)::SingularDerivedDynamic>::~Own(&ptr);
  destructorCalled_1 = false;
  basePtr.disposer = (Disposer *)CONCAT44(basePtr.disposer._4_4_,0x7b);
  _destructorCalled = 0x1c8;
  heap<kj::(anonymous_namespace)::MultipleDerivedDynamic,int,int,bool&>
            ((kj *)&ptr,(int *)&basePtr,(int *)&destructorCalled,&destructorCalled_1);
  pSVar3 = ptr.ptr;
  pDVar2 = ptr.disposer;
  if (ptr.ptr == (SingularDerivedDynamic *)0x0) {
    pSVar4 = (SingularDerivedDynamic *)0x0;
  }
  else {
    pSVar4 = (SingularDerivedDynamic *)
             ((long)&((ptr.ptr)->super_DynamicType1)._vptr_DynamicType1 +
             (long)((ptr.ptr)->super_DynamicType1)._vptr_DynamicType1[-2]);
  }
  ptr.ptr = (SingularDerivedDynamic *)0x0;
  if (pSVar4 != pSVar3 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0xcd,ERROR,"\"failed: expected \" \"voidPtr.get() == implicitCast<void*>(addr)\"",
               (char (*) [60])"failed: expected voidPtr.get() == implicitCast<void*>(addr)");
  }
  if ((destructorCalled_1 == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0xcf,ERROR,"\"failed: expected \" \"!destructorCalled\"",
               (char (*) [35])"failed: expected !destructorCalled");
  }
  if (pSVar4 != (SingularDerivedDynamic *)0x0) {
    (**pDVar2->_vptr_Disposer)(pDVar2,pSVar4);
  }
  if ((destructorCalled_1 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0xd1,ERROR,"\"failed: expected \" \"destructorCalled\"",
               (char (*) [34])"failed: expected destructorCalled");
  }
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>::~Own
            ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)&ptr);
  destructorCalled_1 = false;
  basePtr.disposer = (Disposer *)CONCAT44(basePtr.disposer._4_4_,0x7b);
  _destructorCalled = 0x1c8;
  heap<kj::(anonymous_namespace)::MultipleDerivedDynamic,int,int,bool&>
            ((kj *)&ptr,(int *)&basePtr,(int *)&destructorCalled,&destructorCalled_1);
  pSVar3 = ptr.ptr;
  basePtr.disposer = ptr.disposer;
  ppbVar1 = &(ptr.ptr)->destructorCalled;
  ptr.ptr = (SingularDerivedDynamic *)0x0;
  if (pSVar3 == (SingularDerivedDynamic *)0x0) {
    if (_::Debug::minSeverity < 3) {
      basePtr.ptr = (DynamicType2 *)pSVar3;
      _::Debug::log<char_const(&)[74]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0xe3,ERROR,
                 "\"failed: expected \" \"static_cast<void*>(baseAddr) != static_cast<void*>(addr)\""
                 ,(char (*) [74])
                  "failed: expected static_cast<void*>(baseAddr) != static_cast<void*>(addr)");
    }
    pSVar4 = (SingularDerivedDynamic *)0x0;
  }
  else {
    pSVar4 = (SingularDerivedDynamic *)((long)ppbVar1 + *(long *)(*ppbVar1 + -0x10));
  }
  basePtr.ptr = (DynamicType2 *)0x0;
  if (pSVar4 != pSVar3 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0xe6,ERROR,"\"failed: expected \" \"voidPtr.get() == static_cast<void*>(addr)\"",
               (char (*) [59])"failed: expected voidPtr.get() == static_cast<void*>(addr)");
  }
  if ((destructorCalled_1 == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0xe8,ERROR,"\"failed: expected \" \"!destructorCalled\"",
               (char (*) [35])"failed: expected !destructorCalled");
  }
  if (pSVar4 != (SingularDerivedDynamic *)0x0) {
    (**(ptr.disposer)->_vptr_Disposer)(ptr.disposer,pSVar4);
  }
  if ((destructorCalled_1 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0xea,ERROR,"\"failed: expected \" \"destructorCalled\"",
               (char (*) [34])"failed: expected destructorCalled");
  }
  Own<kj::(anonymous_namespace)::DynamicType2>::~Own(&basePtr);
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>::~Own
            ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)&ptr);
  return;
}

Assistant:

TEST(Memory, OwnVoid) {
  {
    Own<StaticType> ptr = heap<StaticType>({123});
    StaticType* addr = ptr.get();
    Own<void> voidPtr = kj::mv(ptr);
    KJ_EXPECT(voidPtr.get() == implicitCast<void*>(addr));
  }

  {
    bool destructorCalled = false;
    Own<SingularDerivedDynamic> ptr = heap<SingularDerivedDynamic>(123, destructorCalled);
    SingularDerivedDynamic* addr = ptr.get();
    Own<void> voidPtr = kj::mv(ptr);
    KJ_EXPECT(voidPtr.get() == implicitCast<void*>(addr));
  }

  {
    bool destructorCalled = false;
    Own<MultipleDerivedDynamic> ptr = heap<MultipleDerivedDynamic>(123, 456, destructorCalled);
    MultipleDerivedDynamic* addr = ptr.get();
    Own<void> voidPtr = kj::mv(ptr);
    KJ_EXPECT(voidPtr.get() == implicitCast<void*>(addr));

    KJ_EXPECT(!destructorCalled);
    voidPtr = nullptr;
    KJ_EXPECT(destructorCalled);
  }

  {
    bool destructorCalled = false;
    Own<MultipleDerivedDynamic> ptr = heap<MultipleDerivedDynamic>(123, 456, destructorCalled);
    MultipleDerivedDynamic* addr = ptr.get();
    Own<DynamicType2> basePtr = kj::mv(ptr);
    DynamicType2* baseAddr = basePtr.get();

    // On most (all?) C++ ABIs, the second base class in a multiply-inherited class is offset from
    // the beginning of the object (assuming the first base class has non-zero size). We use this
    // fact here to verify that then casting to Own<void> does in fact result in a pointer that
    // points to the start of the overall object, not the base class. We expect that the pointers
    // are different here to prove that the test below is non-trivial.
    //
    // If there is some other ABI where these pointers are the same, and thus this expectation
    // fails, then it's no problem to #ifdef out the expectation on that platform.
    KJ_EXPECT(static_cast<void*>(baseAddr) != static_cast<void*>(addr));

    Own<void> voidPtr = kj::mv(basePtr);
    KJ_EXPECT(voidPtr.get() == static_cast<void*>(addr));

    KJ_EXPECT(!destructorCalled);
    voidPtr = nullptr;
    KJ_EXPECT(destructorCalled);
  }
}